

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[21]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,bool *params,
          char (*params_1) [21])

{
  undefined4 in_register_00000014;
  char (*params_00) [21];
  long lVar1;
  String argValues [2];
  
  this->exception = (Exception *)0x0;
  str<bool&>(argValues,(kj *)params,(bool *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[21]>(argValues + 1,(kj *)params_1,params_00);
  init(this,(EVP_PKEY_CTX *)file);
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}